

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleConfigureCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  char *value;
  undefined1 local_238 [8];
  string output;
  ostringstream local_1f8 [8];
  ostringstream err;
  uint local_80;
  bool local_7b;
  bool local_7a;
  allocator local_79;
  uint i;
  bool atOnly;
  bool escapeQuotes;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"No input string specified.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  else {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_20);
    if (sVar3 < 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i,"No output variable specified.",&local_79);
      cmCommand::SetError(&this->super_cmCommand,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      this_local._7_1_ = 0;
    }
    else {
      local_7a = false;
      local_7b = false;
      local_80 = 3;
      while( true ) {
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_20);
        if (sVar3 <= local_80) break;
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,(ulong)local_80);
        bVar2 = std::operator==(pvVar4,"@ONLY");
        if (bVar2) {
          local_7b = true;
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_20,(ulong)local_80);
          bVar2 = std::operator==(pvVar4,"ESCAPE_QUOTES");
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream(local_1f8);
            poVar5 = std::operator<<((ostream *)local_1f8,"Unrecognized argument \"");
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](local_20,(ulong)local_80);
            poVar5 = std::operator<<(poVar5,(string *)pvVar4);
            std::operator<<(poVar5,"\"");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)((long)&output.field_2 + 8));
            std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream(local_1f8);
            goto LAB_007ea66f;
          }
          local_7a = true;
        }
        local_80 = local_80 + 1;
      }
      std::__cxx11::string::string((string *)local_238);
      pcVar1 = (this->super_cmCommand).Makefile;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,1);
      cmMakefile::ConfigureString(pcVar1,pvVar4,(string *)local_238,local_7b,local_7a);
      pcVar1 = (this->super_cmCommand).Makefile;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,2);
      value = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(pcVar1,pvVar4,value);
      this_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)local_238);
    }
  }
LAB_007ea66f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmStringCommand::HandleConfigureCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 2) {
    this->SetError("No input string specified.");
    return false;
  }
  if (args.size() < 3) {
    this->SetError("No output variable specified.");
    return false;
  }

  // Parse options.
  bool escapeQuotes = false;
  bool atOnly = false;
  for (unsigned int i = 3; i < args.size(); ++i) {
    if (args[i] == "@ONLY") {
      atOnly = true;
    } else if (args[i] == "ESCAPE_QUOTES") {
      escapeQuotes = true;
    } else {
      std::ostringstream err;
      err << "Unrecognized argument \"" << args[i] << "\"";
      this->SetError(err.str());
      return false;
    }
  }

  // Configure the string.
  std::string output;
  this->Makefile->ConfigureString(args[1], output, atOnly, escapeQuotes);

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(args[2], output.c_str());

  return true;
}